

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t,duckdb::BinaryStandardOperatorWrapper,duckdb::DecimalSubtractOverflowCheck,bool,false,false>
               (hugeint_t *ldata,hugeint_t *rdata,hugeint_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  unsigned_long *puVar1;
  hugeint_t right;
  hugeint_t right_00;
  hugeint_t left;
  hugeint_t left_00;
  hugeint_t left_01;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  hugeint_t hVar9;
  uint64_t in_stack_ffffffffffffff98;
  uint64_t in_stack_ffffffffffffffa8;
  uint64_t uVar10;
  int64_t in_stack_ffffffffffffffb0;
  ulong uVar11;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      lVar5 = 8;
      do {
        left_01.upper = in_stack_ffffffffffffffb0;
        left_01.lower = in_stack_ffffffffffffffa8;
        hVar9.upper = (int64_t)result_data;
        hVar9.lower = in_stack_ffffffffffffff98;
        hVar9 = DecimalSubtractOverflowCheck::
                Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>(left_01,hVar9);
        *(uint64_t *)((long)result_data + lVar5 + -8) = hVar9.lower;
        *(int64_t *)((long)&result_data->lower + lVar5) = hVar9.upper;
        lVar5 = lVar5 + 0x10;
        count = count - 1;
      } while (count != 0);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar11 = count + 0x3f >> 6;
    uVar2 = 0;
    uVar8 = 0;
    uVar10 = count;
    do {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar3 = 0xffffffffffffffff;
      }
      else {
        uVar3 = puVar1[uVar2];
      }
      uVar6 = uVar8 + 0x40;
      if (count <= uVar8 + 0x40) {
        uVar6 = count;
      }
      uVar4 = uVar6;
      if (uVar3 != 0) {
        uVar4 = uVar8;
        if (uVar3 == 0xffffffffffffffff) {
          if (uVar8 < uVar6) {
            uVar3 = uVar8 << 4 | 8;
            do {
              left.upper = uVar11;
              left.lower = uVar10;
              right.upper = (int64_t)result_data;
              right.lower = in_stack_ffffffffffffff98;
              hVar9 = DecimalSubtractOverflowCheck::
                      Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>(left,right);
              *(uint64_t *)((long)result_data + (uVar3 - 8)) = hVar9.lower;
              *(int64_t *)((long)&result_data->lower + uVar3) = hVar9.upper;
              uVar8 = uVar8 + 1;
              uVar3 = uVar3 + 0x10;
              uVar4 = uVar8;
            } while (uVar6 != uVar8);
          }
        }
        else {
          count = uVar10;
          if (uVar8 < uVar6) {
            uVar7 = uVar8 << 4 | 8;
            uVar4 = 0;
            do {
              if ((uVar3 >> (uVar4 & 0x3f) & 1) != 0) {
                left_00.upper = uVar11;
                left_00.lower = count;
                right_00.upper = (int64_t)result_data;
                right_00.lower = in_stack_ffffffffffffff98;
                hVar9 = DecimalSubtractOverflowCheck::
                        Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>
                                  (left_00,right_00);
                *(uint64_t *)((long)result_data + (uVar7 - 8)) = hVar9.lower;
                *(int64_t *)((long)&result_data->lower + uVar7) = hVar9.upper;
              }
              uVar4 = uVar4 + 1;
              uVar7 = uVar7 + 0x10;
            } while ((uVar8 - uVar6) + uVar4 != 0);
            uVar4 = uVar8 + uVar4;
            uVar10 = count;
          }
        }
      }
      uVar2 = uVar2 + 1;
      uVar8 = uVar4;
    } while (uVar2 != uVar11);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}